

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

VisitError<typename_TagT<372U,_String>::Type::UnderlyingType> * __thiscall
Fixpp::visitTag<Fixpp::TagT<372u,Fixpp::Type::String>>
          (VisitError<typename_TagT<372U,_String>::Type::UnderlyingType> *__return_storage_ptr__,
          Fixpp *this,char *frame,size_t size)

{
  VisitError<View> local_60;
  char *local_20;
  size_t size_local;
  char *frame_local;
  
  local_20 = frame;
  size_local = (size_t)this;
  frame_local = &__return_storage_ptr__->ok_;
  visitTagView<Fixpp::TagT<372u,Fixpp::Type::String>>(&local_60,this,frame,size);
  result::Result<std::pair<char_const*,unsigned_long>,Fixpp::ErrorKind>::
  map<Fixpp::visitTag<Fixpp::TagT<372u,Fixpp::Type::String>>(char_const*,unsigned_long)::_lambda(std::pair<char_const*,unsigned_long>const&)_1_,Fixpp::result::Result<std::__cxx11::string,Fixpp::ErrorKind>>
            (__return_storage_ptr__,&local_60);
  result::Result<std::pair<const_char_*,_unsigned_long>,_Fixpp::ErrorKind>::~Result(&local_60);
  return __return_storage_ptr__;
}

Assistant:

auto visitTag(const char* frame, size_t size) -> VisitError<typename Tag::Type::UnderlyingType>
    {
        return visitTagView<Tag>(frame, size).map([](const View& view)
        {
            return details::LexicalCast<typename Tag::Type>::cast(view.first, view.second);
        });
    }